

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

vector<Node> * __thiscall vector<Node>::operator=(vector<Node> *this,vector<Node> *other)

{
  uint uVar1;
  Node *pNVar2;
  Node *__s;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar1 = other->_size;
  this->_size = uVar1;
  lVar4 = (long)other->_capacity;
  this->_capacity = other->_capacity;
  uVar5 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar5 = lVar4 * 8;
  }
  __s = (Node *)operator_new__(uVar5);
  if (lVar4 != 0) {
    memset(__s,0,lVar4 * 8);
  }
  this->vect = __s;
  pNVar2 = other->vect;
  uVar3 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar3;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    __s[uVar3] = pNVar2[uVar3];
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }